

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

FIOBJ headers2str(http_s *h,uintptr_t padding)

{
  size_t sVar1;
  FIOBJ FVar2;
  FIOBJ tmp_1;
  ulong local_a8;
  char *local_a0;
  fio_str_info_s local_98;
  fio_str_info_s local_80;
  FIOBJ local_68;
  FIOBJ tmp;
  fio_str_info_s t;
  http1pr_s *p;
  uintptr_t header_length_guess;
  header_writer_s w;
  uintptr_t padding_local;
  http_s *h_local;
  
  if ((h->method == 0) && (h->status_str != 0)) {
    h_local = (http_s *)0x0;
  }
  else {
    w.value = padding;
    if (headers2str::connection_hash == 0) {
      headers2str::connection_hash = fiobj_hash_string("connection",10);
    }
    sVar1 = fiobj_hash_count((h->private_data).out_headers);
    header_length_guess = fiobj_str_buf(sVar1 * 0x40 + w.value);
    t.data = (char *)(h->private_data).flag;
    if (t.data[0x101] == '\0') {
      http1pr_status2str((fio_str_info_s *)&tmp,h->status);
      fiobj_str_write(header_length_guess,(char *)t.len,t.capa);
      local_68 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
      if (local_68 == 0) {
        local_68 = fiobj_hash_get2(h->headers,headers2str::connection_hash);
        if (local_68 == 0) {
          fiobj_obj2cstr((fio_str_info_s *)&tmp_1,h->version);
          tmp = tmp_1;
          t.capa = local_a8;
          t.len = (size_t)local_a0;
          if (((((t.data[0x100] == '\0') && (7 < local_a8)) && (local_a0 != (char *)0x0)) &&
              ((local_a0[5] == '1' && (local_a0[6] == '.')))) && (local_a0[7] == '1')) {
            fiobj_str_write(header_length_guess,"connection:keep-alive\r\n",0x17);
          }
          else {
            fiobj_str_write(header_length_guess,"connection:close\r\n",0x12);
            t.data[0x100] = '\x01';
          }
        }
        else {
          fiobj_obj2cstr(&local_98,local_68);
          tmp = local_98.capa;
          t.capa = local_98.len;
          t.len = (size_t)local_98.data;
          if (((local_98.data == (char *)0x0) || (local_98.len == 0)) ||
             ((*local_98.data == 'k' || (*local_98.data == 'K')))) {
            fiobj_str_write(header_length_guess,"connection:keep-alive\r\n",0x17);
          }
          else {
            fiobj_str_write(header_length_guess,"connection:close\r\n",0x12);
            t.data[0x100] = '\x01';
          }
        }
      }
      else {
        fiobj_obj2cstr(&local_80,local_68);
        tmp = local_80.capa;
        t.capa = local_80.len;
        t.len = (size_t)local_80.data;
        if ((*local_80.data == 'c') || (*local_80.data == 'C')) {
          t.data[0x100] = '\x01';
        }
      }
    }
    else {
      if (h->method == 0) {
        fiobj_str_write(header_length_guess,"GET ",4);
      }
      else {
        fiobj_str_concat(header_length_guess,h->method);
        fiobj_str_write(header_length_guess," ",1);
      }
      fiobj_str_concat(header_length_guess,h->path);
      if (h->query != 0) {
        fiobj_str_write(header_length_guess,"?",1);
        fiobj_str_concat(header_length_guess,h->query);
      }
      fiobj_str_write(header_length_guess," HTTP/1.1\r\n",0xb);
      if (headers2str::host_hash == 0) {
        headers2str::host_hash = fiobj_hash_string("host",4);
      }
      FVar2 = fiobj_hash_get2((h->private_data).out_headers,headers2str::host_hash);
      if ((FVar2 == 0) && (FVar2 = fiobj_hash_get2(h->headers,headers2str::host_hash), FVar2 != 0))
      {
        fiobj_str_write(header_length_guess,"host:",5);
        fiobj_str_concat(header_length_guess,FVar2);
        fiobj_str_write(header_length_guess,"\r\n",2);
      }
      FVar2 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
      if (FVar2 == 0) {
        fiobj_str_write(header_length_guess,"connection:keep-alive\r\n",0x17);
      }
    }
    fiobj_each1((h->private_data).out_headers,0,write_header,&header_length_guess);
    fiobj_str_write(header_length_guess,"\r\n",2);
    h_local = (http_s *)header_length_guess;
  }
  return (FIOBJ)h_local;
}

Assistant:

static FIOBJ headers2str(http_s *h, uintptr_t padding) {
  if (!h->method && !!h->status_str)
    return FIOBJ_INVALID;

  static uintptr_t connection_hash;
  if (!connection_hash)
    connection_hash = fiobj_hash_string("connection", 10);

  struct header_writer_s w;
  {
    const uintptr_t header_length_guess =
        fiobj_hash_count(h->private_data.out_headers) * 64;
    w.dest = fiobj_str_buf(header_length_guess + padding);
  }
  http1pr_s *p = handle2pr(h);

  if (p->is_client == 0) {
    fio_str_info_s t = http1pr_status2str(h->status);
    fiobj_str_write(w.dest, t.data, t.len);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, connection_hash);
    if (tmp) {
      t = fiobj_obj2cstr(tmp);
      if (t.data[0] == 'c' || t.data[0] == 'C')
        p->close = 1;
    } else {
      tmp = fiobj_hash_get2(h->headers, connection_hash);
      if (tmp) {
        t = fiobj_obj2cstr(tmp);
        if (!t.data || !t.len || t.data[0] == 'k' || t.data[0] == 'K')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      } else {
        t = fiobj_obj2cstr(h->version);
        if (!p->close && t.len > 7 && t.data && t.data[5] == '1' &&
            t.data[6] == '.' && t.data[7] == '1')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      }
    }
  } else {
    if (h->method) {
      fiobj_str_join(w.dest, h->method);
      fiobj_str_write(w.dest, " ", 1);
    } else {
      fiobj_str_write(w.dest, "GET ", 4);
    }
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    fiobj_str_write(w.dest, " HTTP/1.1\r\n", 11);
    /* make sure we have a host header? */
    static uint64_t host_hash;
    if (!host_hash)
      host_hash = fiobj_hash_string("host", 4);
    FIOBJ tmp;
    if (!fiobj_hash_get2(h->private_data.out_headers, host_hash) &&
        (tmp = fiobj_hash_get2(h->headers, host_hash))) {
      fiobj_str_write(w.dest, "host:", 5);
      fiobj_str_join(w.dest, tmp);
      fiobj_str_write(w.dest, "\r\n", 2);
    }
    if (!fiobj_hash_get2(h->private_data.out_headers, connection_hash))
      fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
  }

  fiobj_each1(h->private_data.out_headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  return w.dest;
}